

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O0

void __thiscall helics::BrokerBase::generateNewIdentifier(BrokerBase *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000020;
  
  genId_abi_cxx11_();
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_00000020,in_stack_00000018);
  std::__cxx11::string::~string(in_RDI);
  *(undefined1 *)((long)&in_RDI[0x10]._M_string_length + 6) = 0;
  return;
}

Assistant:

void BrokerBase::generateNewIdentifier()
{
    identifier = genId();
    uuid_like = false;
}